

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.hpp
# Opt level: O0

void __thiscall CholeskyFactor::solve(CholeskyFactor *this,QpVector *rhs)

{
  QpVector *in_RSI;
  QpVector *in_RDI;
  CholeskyFactor *unaff_retaddr;
  QpVector *in_stack_00000008;
  CholeskyFactor *in_stack_00000010;
  CholeskyFactor *in_stack_00000200;
  
  if (((in_RDI->num_nz & 1) == 0) ||
     (((in_RDI->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_start[1] / 2 <= in_RDI->dim && ((in_RDI[1].num_nz & 1) == 0)))) {
    recompute(in_stack_00000200);
  }
  solveL(unaff_retaddr,in_RDI);
  solveLT(in_stack_00000010,in_stack_00000008);
  QpVector::resparsify(in_RSI);
  return;
}

Assistant:

void solve(QpVector& rhs) {
    if (!uptodate || (numberofreduces >= runtime.instance.num_var / 2 &&
                      !has_negative_eigenvalue)) {
      recompute();
    }
    solveL(rhs);
    solveLT(rhs);

    rhs.resparsify();
  }